

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::enqueueSubresUpload
          (QRhiGles2 *this,QGles2Texture *texD,QGles2CommandBuffer *cbD,int layer,int level,
          QRhiTextureSubresourceUploadDescription *subresDesc)

{
  uint uVar1;
  QSize size_00;
  QSize size_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  Command *pCVar8;
  qsizetype qVar9;
  void *pvVar10;
  uint in_ECX;
  long in_RSI;
  QRhiImplementation *in_RDI;
  float in_R8D;
  QRhiTextureSubresourceUploadDescription *in_R9;
  long in_FS_OFFSET;
  Command *cmd_2;
  Command *cmd_1;
  Command *cmd;
  int arraySize;
  int depth;
  uchar *data;
  GLenum faceTargetBase;
  bool isCubeMap;
  bool isCompressed;
  QSize size_2;
  QSize size_1;
  QByteArray zeroBuf;
  quint32 byteSize;
  QPoint sp;
  QSize size;
  QImage img;
  anon_class_80_10_ff4bedf3 setCmdByNotCompressedData;
  QByteArray rawData;
  QPoint dp;
  GLenum effectiveTarget;
  bool isArray;
  bool is1D;
  bool is3D;
  QRhiTextureSubresourceUploadDescription *in_stack_fffffffffffffd68;
  QGles2CommandBuffer *in_stack_fffffffffffffd70;
  QGles2CommandBuffer *in_stack_fffffffffffffd78;
  QRhiGles2 *in_stack_fffffffffffffd80;
  Format format;
  undefined4 in_stack_fffffffffffffd88;
  quint32 in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  uint uVar11;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  Representation in_stack_fffffffffffffda8;
  Representation in_stack_fffffffffffffdac;
  QRhiImplementation *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  byte local_1fe;
  uint local_1fc;
  int local_1f4;
  char local_1a8 [32];
  QSize local_188;
  QSize local_180;
  QSize local_178;
  QSize local_170;
  QSize local_168;
  QByteArray local_160;
  uint local_148;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_144;
  int local_140 [2];
  QSize local_138;
  QImage local_130 [2];
  int local_100 [2];
  QSize local_f8;
  QSize local_f0;
  QPoint local_e8;
  QPoint local_e0;
  QSize local_d8;
  QSize local_d0;
  undefined1 local_c8 [16];
  QImageData *local_b8;
  QImage local_b0;
  undefined1 local_98 [8];
  long *local_90;
  undefined1 *local_88;
  float *local_80;
  float *local_78;
  QPoint *local_70;
  byte *local_68;
  byte *local_60;
  uint *local_58;
  byte *local_50;
  QByteArray local_48;
  QPoint local_30;
  float local_28;
  byte local_23;
  byte local_22;
  byte local_21;
  float local_20;
  uint local_1c;
  undefined1 local_18 [8];
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RSI;
  trackedImageBarrier(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                      (QGles2Texture *)in_stack_fffffffffffffd70,
                      (Access)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  bVar2 = QRhiImplementation::isCompressedFormat(in_RDI,*(Format *)(local_10 + 0x30));
  bVar3 = QFlags<QRhiTexture::Flag>::testFlag
                    ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffd70,
                     (Flag)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  local_21 = QFlags<QRhiTexture::Flag>::testFlag
                       ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffd70,
                        (Flag)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  local_22 = QFlags<QRhiTexture::Flag>::testFlag
                       ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffd70,
                        (Flag)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  local_23 = QFlags<QRhiTexture::Flag>::testFlag
                       ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffd70,
                        (Flag)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  if (bVar3) {
    local_1f4 = 0x8515;
    local_1fc = local_1c;
  }
  else {
    local_1f4 = *(int *)(local_10 + 0x6c);
    local_1fc = 0;
  }
  local_28 = (float)(local_1f4 + local_1fc);
  local_30 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QRhiTextureSubresourceUploadDescription::destinationTopLeft
                       ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QRhiTextureSubresourceUploadDescription::data(in_stack_fffffffffffffd68);
  memset(local_98,0xaa,0x50);
  local_90 = &local_10;
  local_88 = local_18;
  local_80 = &local_28;
  local_78 = &local_20;
  local_70 = &local_30;
  local_68 = &local_22;
  local_60 = &local_23;
  local_58 = &local_1c;
  local_50 = &local_21;
  QRhiTextureSubresourceUploadDescription::image(in_stack_fffffffffffffd68);
  bVar3 = QImage::isNull(&local_b0);
  QImage::~QImage((QImage *)in_stack_fffffffffffffd70);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar3 = QByteArray::isEmpty((QByteArray *)0x921fac);
    if ((bVar3) || (!bVar2)) {
      bVar2 = QByteArray::isEmpty((QByteArray *)0x9226ba);
      if (bVar2) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),(char *)in_stack_fffffffffffffd68
                  );
        QMessageLogger::warning
                  (local_1a8,"Invalid texture upload for %p layer=%d mip=%d",local_10,
                   (ulong)local_1c,(ulong)(uint)local_20);
      }
      else {
        local_178 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_180 = QRhiTextureSubresourceUploadDescription::sourceSize
                              ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70)
        ;
        bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd80);
        if (bVar2) {
          local_178 = QRhi::sizeForMipLevel
                                ((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                                 (QSize *)in_stack_fffffffffffffd78);
        }
        else {
          local_178 = QRhiTextureSubresourceUploadDescription::sourceSize
                                ((QRhiTextureSubresourceUploadDescription *)
                                 in_stack_fffffffffffffd70);
        }
        QGles2CommandBuffer::retainData
                  (in_stack_fffffffffffffd70,(QByteArray *)in_stack_fffffffffffffd68);
        local_188 = local_178;
        QRhiTextureSubresourceUploadDescription::dataStride(in_R9);
        size_01.ht.m_i = in_stack_fffffffffffffdac.m_i;
        size_01.wd.m_i = in_stack_fffffffffffffda8.m_i;
        enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
                  ((anon_class_80_10_ff4bedf3 *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (void *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),size_01,
                   in_stack_fffffffffffffd8c);
      }
    }
    else {
      local_140[1] = 1;
      puVar7 = (uint *)qMax<int>(local_140 + 1,(int *)(local_10 + 0x3c));
      uVar11 = *puVar7;
      local_140[0] = 0;
      puVar7 = (uint *)qMax<int>(local_140,(int *)(local_10 + 0x40));
      uVar1 = *puVar7;
      local_144.super_QFlagsStorage<QRhiTexture::Flag>.i =
           (QFlagsStorage<QRhiTexture::Flag>)
           QRhiTexture::flags((QRhiTexture *)in_stack_fffffffffffffd70);
      bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                        ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffd70,
                         (Flag)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      if (((bVar2) || ((local_21 & 1) != 0)) ||
         (in_stack_fffffffffffffdac.m_i = in_stack_fffffffffffffdac.m_i & 0xffffff,
         (local_23 & 1) != 0)) {
        in_stack_fffffffffffffdac.m_i =
             CONCAT13(*(undefined1 *)(local_10 + 0x99),(int3)in_stack_fffffffffffffdac.m_i) ^
             0xff000000;
      }
      if ((in_stack_fffffffffffffdac.m_i & 0x1000000) != UnknownFormat) {
        local_148 = 0;
        QRhiImplementation::compressedFormatInfo
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac.m_i,
                   (QSize *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (quint32 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   (quint32 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (QSize *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        if ((local_21 & 1) != 0) {
          local_148 = uVar11 * local_148;
        }
        if ((local_23 & 1) != 0) {
          local_148 = uVar1 * local_148;
        }
        local_160.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_160.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_160.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_160,(ulong)local_148,'\0');
        pCVar8 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                            in_stack_fffffffffffffd80);
        pCVar8->cmd = CompressedImage;
        (pCVar8->args).beginFrame.timestampQuery = *(GLuint *)(local_10 + 0x6c);
        (pCVar8->args).viewport.y = *(float *)(local_10 + 100);
        (pCVar8->args).viewport.w = local_28;
        (pCVar8->args).viewport.h = local_20;
        (pCVar8->args).viewport.d0 = *(float *)(local_10 + 0x70);
        iVar4 = QSize::width((QSize *)0x9221f5);
        (pCVar8->args).getBufferSubData.size = iVar4;
        if (((local_22 & 1) == 0) || (uVar6 = uVar1, (local_23 & 1) == 0)) {
          uVar6 = QSize::height((QSize *)0x922234);
        }
        (pCVar8->args).bindShaderResources.dynamicOffsetCount = uVar6;
        uVar6 = uVar11;
        if (((local_21 & 1) == 0) && (uVar6 = uVar1, (local_23 & 1) == 0)) {
          uVar6 = 0;
        }
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[0] = uVar6;
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[1] = local_148;
        pvVar10 = QGles2CommandBuffer::retainData
                            (in_stack_fffffffffffffd70,(QByteArray *)in_stack_fffffffffffffd68);
        (pCVar8->args).compressedImage.data = pvVar10;
        *(undefined1 *)(local_10 + 0x99) = 1;
        QByteArray::~QByteArray((QByteArray *)0x9222e6);
      }
      local_168 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_170 = QRhiTextureSubresourceUploadDescription::sourceSize
                            ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
      bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd80);
      if (bVar2) {
        local_168 = QRhi::sizeForMipLevel
                              ((int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                               (QSize *)in_stack_fffffffffffffd78);
      }
      else {
        local_168 = QRhiTextureSubresourceUploadDescription::sourceSize
                              ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70)
        ;
      }
      if (((*(byte *)(local_10 + 0x98) & 1) == 0) && ((*(byte *)(local_10 + 0x99) & 1) == 0)) {
        pCVar8 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                            in_stack_fffffffffffffd80);
        pCVar8->cmd = CompressedImage;
        (pCVar8->args).beginFrame.timestampQuery = *(GLuint *)(local_10 + 0x6c);
        (pCVar8->args).viewport.y = *(float *)(local_10 + 100);
        (pCVar8->args).viewport.w = local_28;
        (pCVar8->args).viewport.h = local_20;
        (pCVar8->args).viewport.d0 = *(float *)(local_10 + 0x70);
        iVar4 = QSize::width((QSize *)0x9225cf);
        (pCVar8->args).getBufferSubData.size = iVar4;
        if (((local_22 & 1) == 0) || (uVar6 = uVar1, (local_23 & 1) == 0)) {
          uVar6 = QSize::height((QSize *)0x92260a);
        }
        (pCVar8->args).bindShaderResources.dynamicOffsetCount = uVar6;
        if (((local_21 & 1) == 0) && (uVar11 = uVar1, (local_23 & 1) == 0)) {
          uVar11 = 0;
        }
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[0] = uVar11;
        qVar9 = QByteArray::size(&local_48);
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[1] = (uint)qVar9;
        pvVar10 = QGles2CommandBuffer::retainData
                            (in_stack_fffffffffffffd70,(QByteArray *)in_stack_fffffffffffffd68);
        (pCVar8->args).compressedImage.data = pvVar10;
      }
      else {
        pCVar8 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)
                            in_stack_fffffffffffffd80);
        pCVar8->cmd = CompressedSubImage;
        (pCVar8->args).beginFrame.timestampQuery = *(GLuint *)(local_10 + 0x6c);
        (pCVar8->args).viewport.y = *(float *)(local_10 + 100);
        (pCVar8->args).viewport.w = local_28;
        (pCVar8->args).viewport.h = local_20;
        iVar4 = QPoint::x((QPoint *)0x922410);
        (pCVar8->args).bindVertexBuffer.binding = iVar4;
        if (((local_22 & 1) == 0) || (uVar5 = local_1c, (local_23 & 1) == 0)) {
          uVar5 = QPoint::y((QPoint *)0x92244b);
        }
        (pCVar8->args).getBufferSubData.size = uVar5;
        if (((local_21 & 1) == 0) && ((local_23 & 1) == 0)) {
          local_1c = 0;
        }
        (pCVar8->args).drawIndexed.baseVertex = local_1c;
        iVar4 = QSize::width((QSize *)0x9224a3);
        (pCVar8->args).subImage.w = iVar4;
        iVar4 = QSize::height((QSize *)0x9224bd);
        (pCVar8->args).subImage.h = iVar4;
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[2] = *(uint *)(local_10 + 0x70);
        qVar9 = QByteArray::size(&local_48);
        (pCVar8->args).bindShaderResources.dynamicOffsetPairs[3] = (uint)qVar9;
        pvVar10 = QGles2CommandBuffer::retainData
                            (in_stack_fffffffffffffd70,(QByteArray *)in_stack_fffffffffffffd68);
        (pCVar8->args).compressedSubImage.data = pvVar10;
      }
    }
  }
  else {
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    QRhiTextureSubresourceUploadDescription::image(in_stack_fffffffffffffd68);
    local_d0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_d0 = QImage::size((QImage *)in_stack_fffffffffffffd70);
    local_d8 = QRhiTextureSubresourceUploadDescription::sourceSize
                         ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
    bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd80);
    local_1fe = 1;
    if (bVar2) {
      local_e0 = QRhiTextureSubresourceUploadDescription::sourceTopLeft
                           ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
      bVar2 = QPoint::isNull((QPoint *)in_stack_fffffffffffffd80);
      local_1fe = bVar2 ^ 0xff;
    }
    if ((local_1fe & 1) != 0) {
      local_e8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = QRhiTextureSubresourceUploadDescription::sourceTopLeft
                           ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
      local_f0 = QRhiTextureSubresourceUploadDescription::sourceSize
                           ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
      bVar2 = QSize::isEmpty((QSize *)in_stack_fffffffffffffd80);
      format = (Format)((ulong)in_stack_fffffffffffffd80 >> 0x20);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_f8 = QRhiTextureSubresourceUploadDescription::sourceSize
                             ((QRhiTextureSubresourceUploadDescription *)in_stack_fffffffffffffd70);
        local_d0 = local_f8;
      }
      if ((*(ushort *)(in_RDI[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >>
           10 & 1) == 0) {
        uVar5 = QPoint::x((QPoint *)0x921ebe);
        QPoint::y((QPoint *)0x921ecf);
        QSize::width((QSize *)0x921ee0);
        QSize::height((QSize *)0x921ef1);
        QImage::copy(local_130,(EVP_PKEY_CTX *)local_c8,(EVP_PKEY_CTX *)(ulong)uVar5);
        QImage::operator=((QImage *)in_stack_fffffffffffffd78,(QImage *)in_stack_fffffffffffffd70);
        QImage::~QImage((QImage *)in_stack_fffffffffffffd70);
      }
      else {
        QGles2CommandBuffer::retainImage
                  (in_stack_fffffffffffffd70,&in_stack_fffffffffffffd68->m_image);
        QImage::constBits((QImage *)local_c8);
        QPoint::y((QPoint *)0x921d58);
        QImage::bytesPerLine((QImage *)local_c8);
        QPoint::x((QPoint *)0x921d92);
        local_100[1] = 1;
        local_100[0] = QImage::depth((QImage *)local_c8);
        local_100[0] = local_100[0] / 8;
        qMax<int>(local_100 + 1,local_100);
        QSize::width((QSize *)0x921e0c);
        QSize::height((QSize *)0x921e20);
        QImage::bytesPerLine((QImage *)local_c8);
        QImage::format((QImage *)local_c8);
        in_stack_fffffffffffffd68 = (QRhiTextureSubresourceUploadDescription *)0x0;
        in_stack_fffffffffffffd70 = (QGles2CommandBuffer *)0x0;
        QImage::QImage((QImage *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (uchar *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
                       CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),format,
                       (QImageCleanupFunction)in_stack_fffffffffffffdb0,
                       (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        QImage::operator=((QImage *)in_stack_fffffffffffffd78,(QImage *)in_stack_fffffffffffffd70);
        QImage::~QImage((QImage *)in_stack_fffffffffffffd70);
      }
    }
    QGles2CommandBuffer::retainImage(in_stack_fffffffffffffd70,&in_stack_fffffffffffffd68->m_image);
    local_138 = local_d0;
    QImage::bytesPerLine((QImage *)local_c8);
    size_00.ht.m_i = in_stack_fffffffffffffdac.m_i;
    size_00.wd.m_i = in_stack_fffffffffffffda8.m_i;
    enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
              ((anon_class_80_10_ff4bedf3 *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (void *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),size_00,
               in_stack_fffffffffffffd8c);
    QImage::~QImage((QImage *)in_stack_fffffffffffffd70);
  }
  QByteArray::~QByteArray((QByteArray *)0x9227d9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::enqueueSubresUpload(QGles2Texture *texD, QGles2CommandBuffer *cbD,
                                    int layer, int level, const QRhiTextureSubresourceUploadDescription &subresDesc)
{
    trackedImageBarrier(cbD, texD, QGles2Texture::AccessUpdate);
    const bool isCompressed = isCompressedFormat(texD->m_format);
    const bool isCubeMap = texD->m_flags.testFlag(QRhiTexture::CubeMap);
    const bool is3D = texD->m_flags.testFlag(QRhiTexture::ThreeDimensional);
    const bool is1D = texD->m_flags.testFlag(QRhiTexture::OneDimensional);
    const bool isArray = texD->m_flags.testFlag(QRhiTexture::TextureArray);
    const GLenum faceTargetBase = isCubeMap ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : texD->target;
    const GLenum effectiveTarget = faceTargetBase + (isCubeMap ? uint(layer) : 0u);
    const QPoint dp = subresDesc.destinationTopLeft();
    const QByteArray rawData = subresDesc.data();

    auto setCmdByNotCompressedData = [&](const void* data, QSize size, quint32 dataStride)
    {
        quint32 bytesPerLine = 0;
        quint32 bytesPerPixel = 0;
        textureFormatInfo(texD->m_format, size, &bytesPerLine, nullptr, &bytesPerPixel);

        QGles2CommandBuffer::Command &cmd(cbD->commands.get());
        cmd.cmd = QGles2CommandBuffer::Command::SubImage;
        cmd.args.subImage.target = texD->target;
        cmd.args.subImage.texture = texD->texture;
        cmd.args.subImage.faceTarget = effectiveTarget;
        cmd.args.subImage.level = level;
        cmd.args.subImage.dx = dp.x();
        cmd.args.subImage.dy = is1D && isArray ? layer : dp.y();
        cmd.args.subImage.dz = is3D || isArray ? layer : 0;
        cmd.args.subImage.w = size.width();
        cmd.args.subImage.h = size.height();
        cmd.args.subImage.glformat = texD->glformat;
        cmd.args.subImage.gltype = texD->gltype;

        if (dataStride == 0)
            dataStride = bytesPerLine;

        cmd.args.subImage.rowStartAlign = (dataStride & 3) ? 1 : 4;
        cmd.args.subImage.rowLength = caps.unpackRowLength ? (bytesPerPixel ? dataStride / bytesPerPixel : 0) : 0;

        cmd.args.subImage.data = data;
    };

    if (!subresDesc.image().isNull()) {
        QImage img = subresDesc.image();
        QSize size = img.size();
        if (!subresDesc.sourceSize().isEmpty() || !subresDesc.sourceTopLeft().isNull()) {
            const QPoint sp = subresDesc.sourceTopLeft();
            if (!subresDesc.sourceSize().isEmpty())
                size = subresDesc.sourceSize();

            if (caps.unpackRowLength) {
                cbD->retainImage(img);
                // create a non-owning wrapper for the subimage
                const uchar *data = img.constBits() + sp.y() * img.bytesPerLine() + sp.x() * (qMax(1, img.depth() / 8));
                img = QImage(data, size.width(), size.height(), img.bytesPerLine(), img.format());
            } else {
                img = img.copy(sp.x(), sp.y(), size.width(), size.height());
            }
        }

        setCmdByNotCompressedData(cbD->retainImage(img), size, img.bytesPerLine());
    } else if (!rawData.isEmpty() && isCompressed) {
        const int depth = qMax(1, texD->m_depth);
        const int arraySize = qMax(0, texD->m_arraySize);
        if ((texD->flags().testFlag(QRhiTexture::UsedAsCompressedAtlas) || is3D || isArray)
                && !texD->zeroInitialized)
        {
            // Create on first upload since glCompressedTexImage2D cannot take
            // nullptr data. We have a rule in the QRhi docs that the first
            // upload for a compressed texture must cover the entire image, but
            // that is clearly not ideal when building a texture atlas, or when
            // having a 3D texture with per-slice data.
            quint32 byteSize = 0;
            compressedFormatInfo(texD->m_format, texD->m_pixelSize, nullptr, &byteSize, nullptr);
            if (is3D)
                byteSize *= depth;
            if (isArray)
                byteSize *= arraySize;
            QByteArray zeroBuf(byteSize, 0);
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = texD->m_pixelSize.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : texD->m_pixelSize.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = byteSize;
            cmd.args.compressedImage.data = cbD->retainData(zeroBuf);
            texD->zeroInitialized = true;
        }

        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();
        if (texD->specified || texD->zeroInitialized) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedSubImage;
            cmd.args.compressedSubImage.target = texD->target;
            cmd.args.compressedSubImage.texture = texD->texture;
            cmd.args.compressedSubImage.faceTarget = effectiveTarget;
            cmd.args.compressedSubImage.level = level;
            cmd.args.compressedSubImage.dx = dp.x();
            cmd.args.compressedSubImage.dy = is1D && isArray ? layer : dp.y();
            cmd.args.compressedSubImage.dz = is3D || isArray ? layer : 0;
            cmd.args.compressedSubImage.w = size.width();
            cmd.args.compressedSubImage.h = size.height();
            cmd.args.compressedSubImage.glintformat = texD->glintformat;
            cmd.args.compressedSubImage.size = rawData.size();
            cmd.args.compressedSubImage.data = cbD->retainData(rawData);
        } else {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = size.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : size.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = rawData.size();
            cmd.args.compressedImage.data = cbD->retainData(rawData);
        }
    } else if (!rawData.isEmpty()) {
        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();

        setCmdByNotCompressedData(cbD->retainData(rawData), size, subresDesc.dataStride());
    } else {
        qWarning("Invalid texture upload for %p layer=%d mip=%d", texD, layer, level);
    }
}